

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant1.c
# Opt level: O0

void alloc_fs_workspace(j_decompress_ptr cinfo)

{
  int iVar1;
  long lVar2;
  undefined8 uVar3;
  long in_RDI;
  int i;
  size_t arraysize;
  my_cquantize_ptr cquantize;
  undefined4 local_1c;
  
  lVar2 = *(long *)(in_RDI + 0x270);
  iVar1 = *(int *)(in_RDI + 0x88);
  for (local_1c = 0; local_1c < *(int *)(in_RDI + 0x90); local_1c = local_1c + 1) {
    uVar3 = (**(code **)(*(long *)(in_RDI + 8) + 8))(in_RDI,1,(ulong)(iVar1 + 2) << 1);
    *(undefined8 *)(lVar2 + 0x70 + (long)local_1c * 8) = uVar3;
  }
  return;
}

Assistant:

LOCAL(void)
alloc_fs_workspace(j_decompress_ptr cinfo)
{
  my_cquantize_ptr cquantize = (my_cquantize_ptr)cinfo->cquantize;
  size_t arraysize;
  int i;

  arraysize = (size_t)((cinfo->output_width + 2) * sizeof(FSERROR));
  for (i = 0; i < cinfo->out_color_components; i++) {
    cquantize->fserrors[i] = (FSERRPTR)
      (*cinfo->mem->alloc_large) ((j_common_ptr)cinfo, JPOOL_IMAGE, arraysize);
  }
}